

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_geom_face(REF_GRID ref_grid,REF_INT node)

{
  REF_DBL *pRVar1;
  REF_INTERP pRVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  bool local_195;
  bool local_194;
  bool local_18b;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_BOOL accept;
  REF_BOOL pliant_smoothing;
  REF_INTERP ref_interp;
  REF_INT interp_guess;
  REF_STATUS interp_status;
  REF_DBL uv_max [2];
  REF_DBL uv_min [2];
  int local_d0;
  int local_cc;
  REF_INT iuv;
  REF_INT tries;
  REF_DBL uv [2];
  REF_DBL backoff;
  REF_DBL normdev;
  REF_DBL normdev_orig;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL min_uv_area;
  REF_DBL qtet;
  REF_DBL qtri;
  REF_DBL qtri_orig;
  REF_DBL qtet_orig;
  REF_DBL uv_ideal [2];
  REF_DBL uv_orig [2];
  REF_INT id;
  REF_BOOL no_quads;
  REF_BOOL geom_face;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->geom;
  _geom_edge = ref_grid->node;
  qtet = 0.0;
  min_uv_area = 0.0;
  pRVar2 = ref_grid->interp;
  if ((node < 0) || (ref_grid->cell[6]->ref_adj->nnode <= node)) {
    local_178 = -1;
  }
  else {
    local_178 = ref_grid->cell[6]->ref_adj->first[node];
  }
  if (local_178 == -1) {
    if ((node < 0) || (ref_grid->cell[10]->ref_adj->nnode <= node)) {
      local_17c = -1;
    }
    else {
      local_17c = ref_grid->cell[10]->ref_adj->first[node];
    }
    if (local_17c == -1) {
      if ((node < 0) || (ref_grid->cell[9]->ref_adj->nnode <= node)) {
        local_180 = -1;
      }
      else {
        local_180 = ref_grid->cell[9]->ref_adj->first[node];
      }
      if (local_180 == -1) {
        if ((node < 0) || (ref_grid->cell[0xb]->ref_adj->nnode <= node)) {
          local_184 = -1;
        }
        else {
          local_184 = ref_grid->cell[0xb]->ref_adj->first[node];
        }
        if (local_184 == -1) {
          ref_geom._4_4_ = node;
          pRStack_18 = ref_grid;
          uVar6 = ref_geom_is_a((REF_GEOM)ref_node,node,0,&geom_face);
          if (uVar6 == 0) {
            uVar6 = ref_geom_is_a((REF_GEOM)ref_node,ref_geom._4_4_,1,&no_quads);
            if (uVar6 == 0) {
              uVar6 = ref_geom_is_a((REF_GEOM)ref_node,ref_geom._4_4_,2,&id);
              if (uVar6 == 0) {
                if ((ref_geom._4_4_ < 0) || (pRStack_18->cell[6]->ref_adj->nnode <= ref_geom._4_4_))
                {
                  local_188 = -1;
                }
                else {
                  local_188 = pRStack_18->cell[6]->ref_adj->first[ref_geom._4_4_];
                }
                if (geom_face == 0) {
                  if (no_quads == 0) {
                    if (id == 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x6b9,"ref_smooth_geom_face","geom face required");
                      ref_grid_local._4_4_ = 1;
                    }
                    else if (local_188 == -1) {
                      uVar6 = ref_geom_unique_id((REF_GEOM)ref_node,ref_geom._4_4_,2,
                                                 (REF_INT *)((long)uv_orig + 0xc));
                      if (uVar6 == 0) {
                        uVar6 = ref_geom_tuv((REF_GEOM)ref_node,ref_geom._4_4_,2,uv_orig[1]._4_4_,
                                             uv_ideal + 1);
                        if (uVar6 == 0) {
                          if (pRStack_18->surf == 0) {
                            uVar6 = ref_smooth_tet_quality_around
                                              (pRStack_18,ref_geom._4_4_,&qtri_orig);
                            if (uVar6 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x6c5,"ref_smooth_geom_face",(ulong)uVar6,"q tet");
                              printf(" %f %f %f\n",_geom_edge->real[ref_geom._4_4_ * 0xf],
                                     _geom_edge->real[ref_geom._4_4_ * 0xf + 1],
                                     _geom_edge->real[ref_geom._4_4_ * 0xf + 2]);
                              return uVar6;
                            }
                          }
                          else {
                            qtri_orig = 1.0;
                          }
                          uVar6 = ref_smooth_tri_quality_around(pRStack_18,ref_geom._4_4_,&qtri);
                          if (uVar6 == 0) {
                            uVar6 = ref_smooth_tri_normdev_around
                                              (pRStack_18,ref_geom._4_4_,&normdev);
                            if (uVar6 == 0) {
                              uVar6 = ref_smooth_tri_ratio_around
                                                (pRStack_18,ref_geom._4_4_,&max_ratio,&normdev_orig)
                              ;
                              if (uVar6 == 0) {
                                bVar4 = false;
                                if ((0.5 < qtri) && (bVar4 = false, 0.5 < max_ratio)) {
                                  bVar4 = normdev_orig < 2.0;
                                }
                                ref_interp._0_4_ = -1;
                                if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
                                  ref_interp._0_4_ = pRVar2->cell[ref_geom._4_4_];
                                }
                                if (bVar4) {
                                  uVar6 = ref_smooth_tri_pliant_uv
                                                    (pRStack_18,ref_geom._4_4_,&qtet_orig);
                                  if (uVar6 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                           ,0x6d8,"ref_smooth_geom_face",(ulong)uVar6,"ideal");
                                    return uVar6;
                                  }
                                }
                                else {
                                  uVar6 = ref_smooth_tri_weighted_ideal_uv
                                                    (pRStack_18,ref_geom._4_4_,&qtet_orig);
                                  if (uVar6 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                           ,0x6da,"ref_smooth_geom_face",(ulong)uVar6,"ideal");
                                    return uVar6;
                                  }
                                }
                                uVar6 = ref_geom_tri_uv_bounding_box
                                                  (pRStack_18,ref_geom._4_4_,uv_max + 1,
                                                   (REF_DBL *)&interp_guess);
                                if (uVar6 == 0) {
                                  uv[1] = 1.0;
                                  for (local_cc = 0; local_cc < 8; local_cc = local_cc + 1) {
                                    for (local_d0 = 0; local_d0 < 2; local_d0 = local_d0 + 1) {
                                      *(double *)(&iuv + (long)local_d0 * 2) =
                                           uv[1] * uv_ideal[(long)local_d0 + -1] +
                                           (1.0 - uv[1]) * uv_ideal[(long)local_d0 + 1];
                                    }
                                    uVar6 = ref_geom_add((REF_GEOM)ref_node,ref_geom._4_4_,2,
                                                         uv_orig[1]._4_4_,(REF_DBL *)&iuv);
                                    if (uVar6 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x6e4,"ref_smooth_geom_face",(ulong)uVar6,"set uv");
                                      return uVar6;
                                    }
                                    uVar6 = ref_geom_constrain(pRStack_18,ref_geom._4_4_);
                                    if (uVar6 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x6e5,"ref_smooth_geom_face",(ulong)uVar6,"constrain")
                                      ;
                                      return uVar6;
                                    }
                                    uVar6 = ref_metric_interpolate_node(pRStack_18,ref_geom._4_4_);
                                    if ((uVar6 != 0) && (uVar6 != 5)) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x6e7,"ref_smooth_geom_face",(ulong)uVar6,
                                             "ref_metric_interpolate_node failed");
                                      return uVar6;
                                    }
                                    if (pRStack_18->surf == 0) {
                                      uVar7 = ref_smooth_tet_quality_around
                                                        (pRStack_18,ref_geom._4_4_,&min_uv_area);
                                      if (uVar7 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x6ee,"ref_smooth_geom_face",(ulong)uVar7,"q tet");
                                        return uVar7;
                                      }
                                      uVar7 = ref_smooth_tet_ratio_around
                                                        (pRStack_18,ref_geom._4_4_,&max_ratio,
                                                         &normdev_orig);
                                      if (uVar7 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x6f0,"ref_smooth_geom_face",(ulong)uVar7,"ratio");
                                        return uVar7;
                                      }
                                    }
                                    else {
                                      min_uv_area = 1.0;
                                      uVar7 = ref_smooth_tri_ratio_around
                                                        (pRStack_18,ref_geom._4_4_,&max_ratio,
                                                         &normdev_orig);
                                      if (uVar7 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x6ec,"ref_smooth_geom_face",(ulong)uVar7,"ratio");
                                        return uVar7;
                                      }
                                    }
                                    uVar7 = ref_smooth_tri_quality_around
                                                      (pRStack_18,ref_geom._4_4_,&qtet);
                                    if (uVar7 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x6f2,"ref_smooth_geom_face",(ulong)uVar7,"q tri");
                                      return uVar7;
                                    }
                                    uVar7 = ref_smooth_tri_normdev_around
                                                      (pRStack_18,ref_geom._4_4_,&backoff);
                                    if (uVar7 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x6f3,"ref_smooth_geom_face",(ulong)uVar7,"nd");
                                      return uVar7;
                                    }
                                    uVar7 = ref_smooth_tri_uv_area_around
                                                      (pRStack_18,ref_geom._4_4_,&min_ratio);
                                    if (uVar7 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x6f4,"ref_smooth_geom_face",(ulong)uVar7,"a");
                                      return uVar7;
                                    }
                                    local_18b = false;
                                    if (uVar6 == 0) {
                                      pRVar1 = &pRStack_18->adapt->post_min_normdev;
                                      local_18b = *pRVar1 <= backoff && backoff != *pRVar1 ||
                                                  normdev < backoff;
                                    }
                                    bVar3 = false;
                                    if (local_18b && normdev * 0.9 < backoff) {
                                      bVar3 = _geom_edge->min_uv_area <= min_ratio &&
                                              min_ratio != _geom_edge->min_uv_area;
                                    }
                                    bVar5 = false;
                                    if ((bVar3) && (bVar5 = false, uv_max[1] < _iuv)) {
                                      bVar5 = _iuv < _interp_guess;
                                    }
                                    bVar3 = false;
                                    if ((bVar5) && (bVar3 = false, uv_min[0] < uv[0])) {
                                      bVar3 = uv[0] < uv_max[0];
                                    }
                                    bVar5 = false;
                                    if (bVar3) {
                                      pRVar1 = &pRStack_18->adapt->smooth_min_quality;
                                      bVar5 = *pRVar1 <= min_uv_area && min_uv_area != *pRVar1;
                                    }
                                    bVar3 = false;
                                    if (bVar5) {
                                      bVar3 = pRStack_18->adapt->post_min_ratio <= max_ratio;
                                    }
                                    local_195 = false;
                                    if (bVar3) {
                                      local_195 = normdev_orig <= pRStack_18->adapt->post_max_ratio;
                                    }
                                    if (bVar4) {
                                      local_194 = (local_195 && qtri * 0.9 < qtet) && 0.4 < qtet;
                                    }
                                    else {
                                      local_195 = local_195 && qtri < qtet;
                                      local_194 = local_195;
                                    }
                                    if (local_194) {
                                      return 0;
                                    }
                                    uv[1] = uv[1] * 0.5;
                                    if (((REF_INT)ref_interp != -1) && (uVar6 != 0)) {
                                      pRVar2->cell[ref_geom._4_4_] = (REF_INT)ref_interp;
                                    }
                                  }
                                  uVar6 = ref_geom_add((REF_GEOM)ref_node,ref_geom._4_4_,2,
                                                       uv_orig[1]._4_4_,uv_ideal + 1);
                                  if (uVar6 == 0) {
                                    uVar6 = ref_geom_constrain(pRStack_18,ref_geom._4_4_);
                                    if (uVar6 == 0) {
                                      ref_grid_local._4_4_ =
                                           ref_metric_interpolate_node(pRStack_18,ref_geom._4_4_);
                                      if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 5)
                                         ) {
                                        ref_grid_local._4_4_ = 0;
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x712,"ref_smooth_geom_face",
                                               (ulong)ref_grid_local._4_4_,"interp");
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x711,"ref_smooth_geom_face",(ulong)uVar6,"constrain")
                                      ;
                                      ref_grid_local._4_4_ = uVar6;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                           ,0x710,"ref_smooth_geom_face",(ulong)uVar6,"set t");
                                    ref_grid_local._4_4_ = uVar6;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,0x6dd,"ref_smooth_geom_face",(ulong)uVar6,"bb");
                                  ref_grid_local._4_4_ = uVar6;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x6ca,"ref_smooth_geom_face",(ulong)uVar6,"ratio");
                                ref_grid_local._4_4_ = uVar6;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x6c8,"ref_smooth_geom_face",(ulong)uVar6,"nd_orig");
                              ref_grid_local._4_4_ = uVar6;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x6c7,"ref_smooth_geom_face",(ulong)uVar6,"q tri");
                            ref_grid_local._4_4_ = uVar6;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x6be,"ref_smooth_geom_face",(ulong)uVar6,"get uv_orig");
                          ref_grid_local._4_4_ = uVar6;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x6bd,"ref_smooth_geom_face",(ulong)uVar6,"get-id");
                        ref_clump_around(pRStack_18,ref_geom._4_4_,"get-id.tec");
                        ref_grid_local._4_4_ = uVar6;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x6ba,"ref_smooth_geom_face","quads not allowed");
                      ref_grid_local._4_4_ = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x6b8,"ref_smooth_geom_face","geom edge not allowed");
                    ref_grid_local._4_4_ = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x6b7,"ref_smooth_geom_face","geom node not allowed");
                  ref_grid_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x6b5,"ref_smooth_geom_face",(ulong)uVar6,"face check");
                ref_grid_local._4_4_ = uVar6;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x6b4,"ref_smooth_geom_face",(ulong)uVar6,"edge check");
              ref_grid_local._4_4_ = uVar6;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x6b3,"ref_smooth_geom_face",(ulong)uVar6,"node check");
            ref_grid_local._4_4_ = uVar6;
          }
        }
        else {
          ref_grid_local._4_4_ = 0;
        }
      }
      else {
        ref_grid_local._4_4_ = 0;
      }
    }
    else {
      ref_grid_local._4_4_ = 0;
    }
  }
  else {
    ref_grid_local._4_4_ = 0;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_geom_face(REF_GRID ref_grid, REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_BOOL geom_node, geom_edge, geom_face, no_quads;
  REF_INT id;
  REF_DBL uv_orig[2], uv_ideal[2];
  REF_DBL qtet_orig, qtri_orig;
  REF_DBL qtri = 0.0, qtet = 0.0, min_uv_area, min_ratio, max_ratio;
  REF_DBL normdev_orig, normdev;
  REF_DBL backoff, uv[2];
  REF_INT tries, iuv;
  REF_DBL uv_min[2], uv_max[2];
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL pliant_smoothing = REF_FALSE;
  REF_BOOL accept;

  REF_BOOL verbose = REF_FALSE;

  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pri(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_hex(ref_grid), node)) return REF_SUCCESS;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face check");
  no_quads = ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  RAS(!geom_node, "geom node not allowed");
  RAS(!geom_edge, "geom edge not allowed");
  RAS(geom_face, "geom face required");
  RAS(no_quads, "quads not allowed");

  RSB(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "get-id",
      ref_clump_around(ref_grid, node, "get-id.tec"));
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "get uv_orig");
  if (ref_grid_surf(ref_grid)) {
    qtet_orig = 1.0;
  } else {
    RSB(ref_smooth_tet_quality_around(ref_grid, node, &qtet_orig), "q tet", {
      printf(" %f %f %f\n", ref_node_xyz(ref_node, 0, node),
             ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));
    });
  }
  RSS(ref_smooth_tri_quality_around(ref_grid, node, &qtri_orig), "q tri");
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");
  pliant_smoothing = (qtri_orig > 0.5 && min_ratio > 0.5 && max_ratio < 2.0);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  if (verbose)
    printf("uv %f %f tri %f tet %f\n", uv_orig[0], uv_orig[1], qtri_orig,
           qtet_orig);

  if (pliant_smoothing) {
    RSS(ref_smooth_tri_pliant_uv(ref_grid, node, uv_ideal), "ideal");
  } else {
    RSS(ref_smooth_tri_weighted_ideal_uv(ref_grid, node, uv_ideal), "ideal");
  }

  RSS(ref_geom_tri_uv_bounding_box(ref_grid, node, uv_min, uv_max), "bb");

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (iuv = 0; iuv < 2; iuv++)
      uv[iuv] = backoff * uv_ideal[iuv] + (1.0 - backoff) * uv_orig[iuv];

    RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv), "set uv");
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");

    if (ref_grid_surf(ref_grid)) {
      qtet = 1.0;
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    } else {
      RSS(ref_smooth_tet_quality_around(ref_grid, node, &qtet), "q tet");
      RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    }
    RSS(ref_smooth_tri_quality_around(ref_grid, node, &qtri), "q tri");
    RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");
    RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "a");

    accept = (REF_SUCCESS == interp_status);
    accept = accept && (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
                        normdev > normdev_orig);
    accept = accept && (normdev > 0.9 * normdev_orig);
    accept = accept && (min_uv_area > ref_node_min_uv_area(ref_node));
    accept = accept && (uv_min[0] < uv[0]) && (uv[0] < uv_max[0]);
    accept = accept && (uv_min[1] < uv[1]) && (uv[1] < uv_max[1]);
    accept = accept && (qtet > ref_grid_adapt(ref_grid, smooth_min_quality));
    accept = accept && (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio));
    accept = accept && (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio));
    if (pliant_smoothing) {
      accept = accept && (qtri > 0.9 * qtri_orig);
      accept = accept && (qtri > 0.4);
    } else {
      accept = accept && (qtri > qtri_orig);
    }

    if (accept) {
      if (verbose) printf("better qtri %f qtet %f\n", qtri, qtet);
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "set t");
  RSS(ref_geom_constrain(ref_grid, node), "constrain");
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  if (verbose)
    printf("undo qtri %f qtet %f was %f %f\n", qtri, qtet, qtri_orig,
           qtet_orig);

  return REF_SUCCESS;
}